

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ScalarNode *scalar)

{
  SmallString<256U> storage;
  StringRef local_130;
  SmallVectorImpl<char> local_120;
  undefined1 local_110 [256];
  
  local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_110;
  local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  local_130 = llvm::yaml::ScalarNode::getValue((ScalarNode *)this,&local_120);
  llvm::StringRef::str_abi_cxx11_(__return_storage_ptr__,&local_130);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl(&local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string stringFromScalarNode(llvm::yaml::ScalarNode* scalar) {
    SmallString<256> storage;
    return scalar->getValue(storage).str();
  }